

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

HME * __thiscall
BCL::
HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
::atomic_get_entry(HME *__return_storage_ptr__,
                  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                  *this,size_type slot)

{
  long lVar1;
  byte bVar2;
  atomic_op<int> *in_R8;
  GlobalPtr<int> ptr_00;
  GlobalPtr<int> ptr_01;
  GlobalPtr<int> ptr_02;
  GlobalPtr<int> ptr_03;
  HME *entry;
  and_<int> local_110;
  uint local_f4;
  BCL *local_f0;
  size_t local_e8;
  int local_dc;
  undefined1 local_d8 [4];
  int rv_2;
  int aiStack_c8 [3];
  uint local_bc;
  BCL *local_b8;
  size_t local_b0;
  int local_a4;
  undefined1 local_a0 [4];
  int rv_1;
  int aiStack_90 [3];
  uint local_84;
  BCL *local_80;
  size_t local_78;
  undefined1 local_68 [4];
  int rv;
  int aiStack_58 [3];
  int local_4c;
  BCL *local_48;
  size_t local_40;
  uint local_34;
  undefined1 auStack_30 [4];
  int return_value;
  GlobalPtr<int> ptr;
  int read_bit;
  int old_value;
  size_type slot_local;
  HashMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
  *this_local;
  
  ptr.ptr._4_4_ = 2;
  lVar1 = lrand48();
  ptr.ptr._0_4_ = (int)(lVar1 % 0x1e) + 2;
  _auStack_30 = slot_used_ptr(this,slot);
  local_48 = _auStack_30;
  local_40 = ptr.rank;
  local_4c = 1 << ((byte)(int)ptr.ptr & 0x1f);
  memset(local_68,0,0x18);
  or_<int>::or_((or_<int> *)local_68);
  ptr_00.ptr = (size_t)&local_4c;
  ptr_00.rank = local_40;
  local_34 = fetch_and_op<int>(local_48,ptr_00,aiStack_58,in_R8);
  bVar2 = (byte)(int)ptr.ptr;
  if (((local_34 & 2) == 0) || ((local_34 & 1 << (bVar2 & 0x1f)) != 0)) {
    if ((local_34 & 3) == 0) {
      if ((local_34 & 1 << (bVar2 & 0x1f)) == 0) {
        local_b8 = _auStack_30;
        local_b0 = ptr.rank;
        local_bc = 1 << (bVar2 & 0x1f) ^ 0xffffffff;
        memset(local_d8,0,0x18);
        and_<int>::and_((and_<int> *)local_d8);
        ptr_02.ptr = (size_t)&local_bc;
        ptr_02.rank = local_b0;
        local_a4 = fetch_and_op<int>(local_b8,ptr_02,aiStack_c8,in_R8);
      }
      memset(__return_storage_ptr__,0,0x20);
      HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
      ::HashMapEntry(__return_storage_ptr__);
    }
    else {
      if ((local_34 & 1 << (bVar2 & 0x1f)) == 0) {
        local_f0 = _auStack_30;
        local_e8 = ptr.rank;
        local_f4 = 1 << (bVar2 & 0x1f) ^ 0xffffffff;
        memset(&local_110,0,0x18);
        and_<int>::and_(&local_110);
        ptr_03.ptr = (size_t)&local_f4;
        ptr_03.rank = local_e8;
        local_dc = fetch_and_op<int>(local_f0,ptr_03,(int *)&local_110.super_atomic_op<int>,in_R8);
      }
      atomic_get_entry(__return_storage_ptr__,this,slot);
    }
  }
  else {
    get_entry(__return_storage_ptr__,this,slot);
    local_80 = _auStack_30;
    local_78 = ptr.rank;
    local_84 = 1 << ((byte)(int)ptr.ptr & 0x1f) ^ 0xffffffff;
    memset(local_a0,0,0x18);
    and_<int>::and_((and_<int> *)local_a0);
    ptr_01.ptr = (size_t)&local_84;
    ptr_01.rank = local_78;
    fetch_and_op<int>(local_80,ptr_01,aiStack_90,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

HME atomic_get_entry(size_type slot) {
    int old_value = ready_flag;

    // Bits 2 -> 32 are for readers to mark reserved
    int read_bit = 2 + (lrand48() % 30);

    auto ptr = slot_used_ptr(slot);

    int return_value = BCL::fetch_and_op<int>(ptr, (0x1 << read_bit), BCL::or_<int>{});

    if (return_value & ready_flag && !(return_value & (0x1 << read_bit))) {
      auto entry = get_entry(slot);
      int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      return entry;
    } else if ((return_value & (0x3)) == 0) {
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return HME{};
    } else {
      // OPTIMIZE: use return value to pick a reader bit "hint"
      //           unclear if this will help, since reader bits
      //           will only ever be flipped for around 4-6us.
      if (!(return_value & (0x1 << read_bit))) {
        int rv = BCL::fetch_and_op<int>(ptr, ~(0x1 << read_bit), BCL::and_<int>{});
      }
      return atomic_get_entry(slot);
    }
  }